

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::format_decimal<signed_char>(char **buffer,char value)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  type_conflict4 tVar3;
  int value_00;
  type tVar4;
  char in_SIL;
  long *in_RDI;
  int num_digits;
  uint index;
  main_type abs_value;
  int in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  char *pcVar5;
  uint local_10;
  
  local_10 = (uint)in_SIL;
  tVar3 = internal::is_negative<signed_char>(in_SIL);
  if (tVar3) {
    puVar2 = (undefined1 *)*in_RDI;
    *in_RDI = (long)(puVar2 + 1);
    *puVar2 = 0x2d;
    local_10 = -local_10;
  }
  if (local_10 < 100) {
    if (local_10 < 10) {
      pcVar5 = (char *)*in_RDI;
      *in_RDI = (long)(pcVar5 + 1);
      *pcVar5 = (char)local_10 + '0';
    }
    else {
      uVar1 = internal::basic_data<void>::DIGITS[local_10 * 2];
      puVar2 = (undefined1 *)*in_RDI;
      *in_RDI = (long)(puVar2 + 1);
      *puVar2 = uVar1;
      uVar1 = internal::basic_data<void>::DIGITS[local_10 * 2 + 1];
      puVar2 = (undefined1 *)*in_RDI;
      *in_RDI = (long)(puVar2 + 1);
      *puVar2 = uVar1;
    }
  }
  else {
    value_00 = internal::count_digits(local_10);
    pcVar5 = (char *)*in_RDI;
    tVar4 = internal::to_unsigned<int>(value_00);
    internal::make_checked<char>(pcVar5,(ulong)tVar4);
    internal::format_decimal<char,char*,unsigned_int>
              (pcVar5,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    *in_RDI = *in_RDI + (long)value_00;
  }
  return;
}

Assistant:

inline void format_decimal(char *&buffer, T value) {
  typedef typename internal::int_traits<T>::main_type main_type;
  main_type abs_value = static_cast<main_type>(value);
  if (internal::is_negative(value)) {
    *buffer++ = '-';
    abs_value = 0 - abs_value;
  }
  if (abs_value < 100) {
    if (abs_value < 10) {
      *buffer++ = static_cast<char>('0' + abs_value);
      return;
    }
    unsigned index = static_cast<unsigned>(abs_value * 2);
    *buffer++ = internal::data::DIGITS[index];
    *buffer++ = internal::data::DIGITS[index + 1];
    return;
  }
  int num_digits = internal::count_digits(abs_value);
  internal::format_decimal<char>(
        internal::make_checked(buffer, internal::to_unsigned(num_digits)), abs_value, num_digits);
  buffer += num_digits;
}